

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall_file.cpp
# Opt level: O2

void __thiscall
foxxll::syscall_file::serve
          (syscall_file *this,void *buffer,offset_type offset,size_type bytes,read_or_write op)

{
  int __fd;
  __off64_t _Var1;
  ssize_t sVar2;
  offset_type oVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  io_error *piVar7;
  size_t __n;
  string local_1e8;
  scoped_read_write_timer read_write_timer;
  unique_lock<std::mutex> fd_lock;
  ostringstream msg;
  
  std::unique_lock<std::mutex>::unique_lock(&fd_lock,&(this->super_ufs_file_base).fd_mutex_);
  file_stats::scoped_read_write_timer::scoped_read_write_timer
            (&read_write_timer,*(file_stats **)&this->field_0x88,bytes,op == WRITE);
  while( true ) {
    if (bytes == 0) {
      file_stats::scoped_read_write_timer::~scoped_read_write_timer(&read_write_timer);
      std::unique_lock<std::mutex>::~unique_lock(&fd_lock);
      return;
    }
    _Var1 = lseek64((this->super_ufs_file_base).file_des_,offset,0);
    if (_Var1 < 0) break;
    __fd = (this->super_ufs_file_base).file_des_;
    if (op == READ) {
      sVar2 = read(__fd,buffer,bytes);
      if (sVar2 < 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
        poVar4 = std::operator<<((ostream *)&msg,"Error in ");
        poVar4 = std::operator<<(poVar4,
                                 "virtual void foxxll::syscall_file::serve(void *, offset_type, size_type, request::read_or_write)"
                                );
        poVar4 = std::operator<<(poVar4," : ");
        poVar4 = std::operator<<(poVar4," this=");
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        poVar4 = std::operator<<(poVar4," call=::read(fd,buffer,bytes)");
        poVar4 = std::operator<<(poVar4," path=");
        poVar4 = std::operator<<(poVar4,(string *)&(this->super_ufs_file_base).filename_);
        poVar4 = std::operator<<(poVar4," fd=");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_ufs_file_base).file_des_);
        poVar4 = std::operator<<(poVar4," offset=");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," buffer=");
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        poVar4 = std::operator<<(poVar4," bytes=");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," op=");
        poVar4 = std::operator<<(poVar4,"READ");
        poVar4 = std::operator<<(poVar4," rc=");
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        poVar4 = std::operator<<(poVar4," : ");
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        std::operator<<(poVar4,pcVar6);
        piVar7 = (io_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        io_error::io_error(piVar7,&local_1e8);
        __cxa_throw(piVar7,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      offset = offset + sVar2;
      buffer = (void *)((long)buffer + sVar2);
      __n = bytes - sVar2;
      bytes = 0;
      if (__n != 0) {
        oVar3 = ufs_file_base::_size(&this->super_ufs_file_base);
        bytes = __n;
        if (offset == oVar3) {
          memset(buffer,0,__n);
          bytes = 0;
        }
      }
    }
    else {
      sVar2 = write(__fd,buffer,bytes);
      if (sVar2 < 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
        poVar4 = std::operator<<((ostream *)&msg,"Error in ");
        poVar4 = std::operator<<(poVar4,
                                 "virtual void foxxll::syscall_file::serve(void *, offset_type, size_type, request::read_or_write)"
                                );
        poVar4 = std::operator<<(poVar4," : ");
        poVar4 = std::operator<<(poVar4," this=");
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        poVar4 = std::operator<<(poVar4," call=::write(fd,buffer,bytes)");
        poVar4 = std::operator<<(poVar4," path=");
        poVar4 = std::operator<<(poVar4,(string *)&(this->super_ufs_file_base).filename_);
        poVar4 = std::operator<<(poVar4," fd=");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_ufs_file_base).file_des_);
        poVar4 = std::operator<<(poVar4," offset=");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," buffer=");
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        poVar4 = std::operator<<(poVar4," bytes=");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," op=");
        poVar4 = std::operator<<(poVar4,"WRITE");
        poVar4 = std::operator<<(poVar4," rc=");
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        poVar4 = std::operator<<(poVar4," : ");
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        std::operator<<(poVar4,pcVar6);
        piVar7 = (io_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        io_error::io_error(piVar7,&local_1e8);
        __cxa_throw(piVar7,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      offset = offset + sVar2;
      buffer = (void *)((long)buffer + sVar2);
      bytes = bytes - sVar2;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar4 = std::operator<<((ostream *)&msg,"Error in ");
  poVar4 = std::operator<<(poVar4,
                           "virtual void foxxll::syscall_file::serve(void *, offset_type, size_type, request::read_or_write)"
                          );
  poVar4 = std::operator<<(poVar4," : ");
  poVar4 = std::operator<<(poVar4," this=");
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  poVar4 = std::operator<<(poVar4," call=::lseek(fd,offset,SEEK_SET)");
  poVar4 = std::operator<<(poVar4," path=");
  poVar4 = std::operator<<(poVar4,(string *)&(this->super_ufs_file_base).filename_);
  poVar4 = std::operator<<(poVar4," fd=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_ufs_file_base).file_des_);
  poVar4 = std::operator<<(poVar4," offset=");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," buffer=");
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  poVar4 = std::operator<<(poVar4," bytes=");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," op=");
  pcVar6 = "WRITE";
  if (op == READ) {
    pcVar6 = "READ";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4," rc=");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," : ");
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  std::operator<<(poVar4,pcVar6);
  piVar7 = (io_error *)__cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  io_error::io_error(piVar7,&local_1e8);
  __cxa_throw(piVar7,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void syscall_file::serve(void* buffer, offset_type offset, size_type bytes,
                         request::read_or_write op)
{
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);

    auto* cbuffer = static_cast<char*>(buffer);

    file_stats::scoped_read_write_timer read_write_timer(
        file_stats_, bytes, op == request::WRITE);

    while (bytes > 0)
    {
        off_t rc = ::lseek(file_des_, offset, SEEK_SET);
        if (rc < 0)
        {
            FOXXLL_THROW_ERRNO(
                io_error,
                " this=" << this <<
                    " call=::lseek(fd,offset,SEEK_SET)" <<
                    " path=" << filename_ <<
                    " fd=" << file_des_ <<
                    " offset=" << offset <<
                    " buffer=" << static_cast<void*>(cbuffer) <<
                    " bytes=" << bytes <<
                    " op=" << ((op == request::READ) ? "READ" : "WRITE") <<
                    " rc=" << rc
            );
        }

        if (op == request::READ)
        {
#if FOXXLL_MSVC
            assert(bytes <= std::numeric_limits<unsigned int>::max());
            if ((rc = ::read(file_des_, cbuffer, (unsigned int)bytes)) <= 0)
#else
            if ((rc = ::read(file_des_, cbuffer, bytes)) <= 0)
#endif
            {
                FOXXLL_THROW_ERRNO(
                    io_error,
                    " this=" << this <<
                        " call=::read(fd,buffer,bytes)" <<
                        " path=" << filename_ <<
                        " fd=" << file_des_ <<
                        " offset=" << offset <<
                        " buffer=" << static_cast<void*>(buffer) <<
                        " bytes=" << bytes <<
                        " op=" << "READ" <<
                        " rc=" << rc
                );
            }
            bytes = static_cast<size_type>(bytes - rc);
            offset += rc;
            cbuffer += rc;

            if (bytes > 0 && offset == this->_size())
            {
                // read request extends past end-of-file
                // fill reminder with zeroes
                memset(cbuffer, 0, bytes);
                bytes = 0;
            }
        }
        else
        {
#if FOXXLL_MSVC
            assert(bytes <= std::numeric_limits<unsigned int>::max());
            if ((rc = ::write(file_des_, cbuffer, (unsigned int)bytes)) <= 0)
#else
            if ((rc = ::write(file_des_, cbuffer, bytes)) <= 0)
#endif
            {
                FOXXLL_THROW_ERRNO(
                    io_error,
                    " this=" << this <<
                        " call=::write(fd,buffer,bytes)" <<
                        " path=" << filename_ <<
                        " fd=" << file_des_ <<
                        " offset=" << offset <<
                        " buffer=" << static_cast<void*>(buffer) <<
                        " bytes=" << bytes <<
                        " op=" << "WRITE" <<
                        " rc=" << rc
                );
            }
            bytes = static_cast<size_type>(bytes - rc);
            offset += rc;
            cbuffer += rc;
        }
    }
}